

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uchar *b;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  uchar local_368 [3];
  char local_365;
  uchar buf [416];
  mbedtls_aes_context aes_ctx;
  uchar tmp [48];
  uchar key [32];
  undefined8 uStack_48;
  uchar chain [16];
  
  if (data_len < 0x181) {
    memset(local_368,0,0x1a0);
    mbedtls_aes_init((mbedtls_aes_context *)(buf + 0x198));
    uVar2 = (uint)data_len;
    buf._8_4_ = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    buf[0xf] = '0';
    memcpy(buf + 0x10,data,data_len);
    buf[data_len + 0x10] = 0x80;
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
      tmp[lVar5 + 0x28] = (uchar)lVar5;
    }
    iVar3 = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(buf + 0x198),tmp + 0x28,0x100);
    if (iVar3 == 0) {
      chain._8_8_ = output;
      for (uVar4 = 0; uVar4 < 0x30; uVar4 = uVar4 + 0x10) {
        uStack_48 = 0;
        chain[0] = '\0';
        chain[1] = '\0';
        chain[2] = '\0';
        chain[3] = '\0';
        chain[4] = '\0';
        chain[5] = '\0';
        chain[6] = '\0';
        chain[7] = '\0';
        b = local_368;
        uVar6 = data_len + 0x19;
        while (uVar1 = chain._0_8_, uVar6 != 0) {
          mbedtls_xor((uchar *)&uStack_48,(uchar *)&uStack_48,b,0x10);
          b = b + 0x10;
          bVar7 = uVar6 < 0x10;
          uVar6 = uVar6 - 0x10;
          if (bVar7) {
            uVar6 = 0;
          }
          iVar3 = mbedtls_aes_crypt_ecb
                            ((mbedtls_aes_context *)(buf + 0x198),1,(uchar *)&uStack_48,
                             (uchar *)&uStack_48);
          output = (uchar *)chain._8_8_;
          if (iVar3 != 0) goto LAB_001eac8d;
        }
        *(undefined8 *)(tmp + (uVar4 - 8)) = uStack_48;
        *(undefined8 *)(tmp + uVar4) = uVar1;
        local_365 = local_365 + '\x01';
      }
      iVar3 = mbedtls_aes_setkey_enc
                        ((mbedtls_aes_context *)(buf + 0x198),(uchar *)(aes_ctx.buf + 0x42),0x100);
      output = (uchar *)chain._8_8_;
      if (iVar3 == 0) {
        lVar5 = 0;
        while ((output = (uchar *)chain._8_8_, iVar3 = 0, (uint)lVar5 < 0x30 &&
               (iVar3 = mbedtls_aes_crypt_ecb
                                  ((mbedtls_aes_context *)(buf + 0x198),1,tmp + 0x18,tmp + 0x18),
               output = (uchar *)chain._8_8_, iVar3 == 0))) {
          *(undefined8 *)(chain._8_8_ + lVar5) = tmp._24_8_;
          *(undefined8 *)((uchar *)(chain._8_8_ + lVar5) + 8) = tmp._32_8_;
          lVar5 = lVar5 + 0x10;
        }
      }
    }
LAB_001eac8d:
    mbedtls_aes_free((mbedtls_aes_context *)(buf + 0x198));
    mbedtls_platform_zeroize(local_368,0x1a0);
    mbedtls_platform_zeroize(aes_ctx.buf + 0x42,0x30);
    mbedtls_platform_zeroize(tmp + 0x28,0x20);
    mbedtls_platform_zeroize(&uStack_48,0x10);
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      mbedtls_platform_zeroize(output,0x30);
    }
  }
  else {
    iVar3 = -0x38;
  }
  return iVar3;
}

Assistant:

static int block_cipher_df(unsigned char *output,
                           const unsigned char *data, size_t data_len)
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
                      MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;
    int ret = 0;

    int i, j;
    size_t buf_len, use_len;

    if (data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }

    memset(buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
           MBEDTLS_CTR_DRBG_BLOCKSIZE + 16);
    mbedtls_aes_init(&aes_ctx);

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    MBEDTLS_PUT_UINT32_BE(data_len, p, 0);
    p += 4 + 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy(p, data, data_len);
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for (i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++) {
        key[i] = i;
    }

    if ((ret = mbedtls_aes_setkey_enc(&aes_ctx, key,
                                      MBEDTLS_CTR_DRBG_KEYBITS)) != 0) {
        goto exit;
    }

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for (j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE) {
        p = buf;
        memset(chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE);
        use_len = buf_len;

        while (use_len > 0) {
            mbedtls_xor(chain, chain, p, MBEDTLS_CTR_DRBG_BLOCKSIZE);
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= (use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            if ((ret = mbedtls_aes_crypt_ecb(&aes_ctx, MBEDTLS_AES_ENCRYPT,
                                             chain, chain)) != 0) {
                goto exit;
            }
        }

        memcpy(tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE);

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    if ((ret = mbedtls_aes_setkey_enc(&aes_ctx, tmp,
                                      MBEDTLS_CTR_DRBG_KEYBITS)) != 0) {
        goto exit;
    }
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for (j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE) {
        if ((ret = mbedtls_aes_crypt_ecb(&aes_ctx, MBEDTLS_AES_ENCRYPT,
                                         iv, iv)) != 0) {
            goto exit;
        }
        memcpy(p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE);
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }
exit:
    mbedtls_aes_free(&aes_ctx);
    /*
     * tidy up the stack
     */
    mbedtls_platform_zeroize(buf, sizeof(buf));
    mbedtls_platform_zeroize(tmp, sizeof(tmp));
    mbedtls_platform_zeroize(key, sizeof(key));
    mbedtls_platform_zeroize(chain, sizeof(chain));
    if (0 != ret) {
        /*
         * wipe partial seed from memory
         */
        mbedtls_platform_zeroize(output, MBEDTLS_CTR_DRBG_SEEDLEN);
    }

    return ret;
}